

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SourceTextModuleRecord.cpp
# Opt level: O0

void __thiscall Js::SourceTextModuleRecord::Finalize(SourceTextModuleRecord *this,bool isShutdown)

{
  ScriptContext *pSVar1;
  ArenaAllocator *pAVar2;
  BaseDictionary<const_char16_t_*,_Js::SourceTextModuleRecord_*,_Memory::ArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
  **ppBVar3;
  nullptr_t local_60;
  WriteBarrierPtr<JsUtil::BaseDictionary<const_char16_t_*,_Js::SourceTextModuleRecord_*,_Memory::ArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>_>
  local_58;
  nullptr_t local_50;
  nullptr_t local_48;
  nullptr_t local_40;
  nullptr_t local_38;
  nullptr_t local_30;
  nullptr_t local_28;
  nullptr_t local_20;
  byte local_11;
  SourceTextModuleRecord *pSStack_10;
  bool isShutdown_local;
  SourceTextModuleRecord *this_local;
  
  local_20 = (nullptr_t)0x0;
  local_11 = isShutdown;
  pSStack_10 = this;
  Memory::WriteBarrierPtr<ParseNodeProg>::operator=(&this->parseTree,&local_20);
  local_28 = (nullptr_t)0x0;
  Memory::WriteBarrierPtr<SList<Ident_*,_Memory::ArenaAllocator,_RealCount>_>::operator=
            (&this->requestedModuleList,&local_28);
  local_30 = (nullptr_t)0x0;
  Memory::WriteBarrierPtr<SList<ModuleImportOrExportEntry,_Memory::ArenaAllocator,_RealCount>_>::
  operator=(&this->importRecordList,&local_30);
  local_38 = (nullptr_t)0x0;
  Memory::WriteBarrierPtr<SList<ModuleImportOrExportEntry,_Memory::ArenaAllocator,_RealCount>_>::
  operator=(&this->localExportRecordList,&local_38);
  local_40 = (nullptr_t)0x0;
  Memory::WriteBarrierPtr<SList<ModuleImportOrExportEntry,_Memory::ArenaAllocator,_RealCount>_>::
  operator=(&this->indirectExportRecordList,&local_40);
  local_48 = (nullptr_t)0x0;
  Memory::WriteBarrierPtr<SList<ModuleImportOrExportEntry,_Memory::ArenaAllocator,_RealCount>_>::
  operator=(&this->starExportRecordList,&local_48);
  local_50 = (nullptr_t)0x0;
  Memory::
  WriteBarrierPtr<JsUtil::List<Js::SourceTextModuleRecord_*,_Memory::Recycler,_false,_Js::CopyRemovePolicy,_DefaultComparer>_>
  ::operator=(&this->parentModuleList,&local_50);
  if ((local_11 & 1) == 0) {
    if (this->parser != (Type)0x0) {
      pSVar1 = Memory::WriteBarrierPtr<Js::ScriptContext>::operator->(&this->scriptContext);
      pAVar2 = ScriptContext::GeneralAllocator(pSVar1);
      Memory::DeleteObject<Memory::ArenaAllocator,(Memory::AllocatorDeleteFlags)0,Parser>
                (pAVar2,this->parser);
      this->parser = (Type)0x0;
    }
    ppBVar3 = Memory::WriteBarrierPtr::operator_cast_to_BaseDictionary__
                        ((WriteBarrierPtr *)&this->childrenModuleSet);
    if (*ppBVar3 !=
        (BaseDictionary<const_char16_t_*,_Js::SourceTextModuleRecord_*,_Memory::ArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
         *)0x0) {
      pSVar1 = Memory::WriteBarrierPtr<Js::ScriptContext>::operator->(&this->scriptContext);
      pAVar2 = ScriptContext::GeneralAllocator(pSVar1);
      Memory::
      WriteBarrierPtr<JsUtil::BaseDictionary<const_char16_t_*,_Js::SourceTextModuleRecord_*,_Memory::ArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>_>
      ::WriteBarrierPtr(&local_58,&this->childrenModuleSet);
      Memory::
      DeleteObject<Memory::ArenaAllocator,(Memory::AllocatorDeleteFlags)0,JsUtil::BaseDictionary<char16_t_const*,Js::SourceTextModuleRecord*,Memory::ArenaAllocator,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>>
                (pAVar2,&local_58);
      local_60 = (nullptr_t)0x0;
      Memory::
      WriteBarrierPtr<JsUtil::BaseDictionary<const_char16_t_*,_Js::SourceTextModuleRecord_*,_Memory::ArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>_>
      ::operator=(&this->childrenModuleSet,&local_60);
    }
  }
  return;
}

Assistant:

void SourceTextModuleRecord::Finalize(bool isShutdown)
    {
        parseTree = nullptr;
        requestedModuleList = nullptr;
        importRecordList = nullptr;
        localExportRecordList = nullptr;
        indirectExportRecordList = nullptr;
        starExportRecordList = nullptr;
        parentModuleList = nullptr;
        if (!isShutdown)
        {
            AdeleteUnlessNull(scriptContext->GeneralAllocator(), parser);
            AdeleteUnlessNull(scriptContext->GeneralAllocator(), childrenModuleSet);
        }
    }